

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O0

void Aig_RManPrintUniqueVars(Aig_VSig_t *pMints,int nVars)

{
  int iVar1;
  int local_18;
  int i;
  int nVars_local;
  Aig_VSig_t *pMints_local;
  
  for (local_18 = 0; local_18 < nVars; local_18 = local_18 + 1) {
    iVar1 = Aig_RManCompareSigs(pMints + (local_18 << 1),pMints + (local_18 * 2 + 1),nVars);
    if (iVar1 == 0) {
      printf("=");
    }
    else {
      printf("x");
    }
  }
  printf("\n");
  printf("0");
  for (local_18 = 1; local_18 < nVars; local_18 = local_18 + 1) {
    iVar1 = Aig_RManCompareSigs(pMints + (local_18 + -1) * 2,pMints + (local_18 << 1),nVars);
    if (iVar1 == 0) {
      printf("-");
    }
    else if (local_18 < 10) {
      printf("%c",(ulong)(local_18 + 0x30));
    }
    else {
      printf("%c",(ulong)(local_18 + 0x37));
    }
  }
  printf("\n");
  return;
}

Assistant:

void Aig_RManPrintUniqueVars( Aig_VSig_t * pMints, int nVars )
{
    int i;
    for ( i = 0; i < nVars; i++ )
        if ( Aig_RManCompareSigs( &pMints[2*i], &pMints[2*i+1], nVars ) == 0 )
            printf( "=" );
        else 
            printf( "x" );
    printf( "\n" );

    printf( "0" );
    for ( i = 1; i < nVars; i++ )
        if ( Aig_RManCompareSigs( &pMints[2*(i-1)], &pMints[2*i], nVars ) == 0 )
            printf( "-" );
        else if ( i < 10 )
            printf( "%c", '0' + i );
        else 
            printf( "%c", 'A' + i-10 );
    printf( "\n" );
}